

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_basic.c
# Opt level: O2

void test_memory_leaks(char *dir,int key_gt_1K,vmemcache_repl_p repl_p,uint seed)

{
  int iVar1;
  VMEMcache *cache;
  char *__s1;
  char *__s2;
  char *pcVar2;
  ulong uVar3;
  undefined8 uVar4;
  FILE *pFVar5;
  stat_t *psVar6;
  stat_t sVar7;
  char *pcVar8;
  char *__format;
  stat_t get;
  size_t sStackY_470;
  char **in_stack_fffffffffffffb98;
  stat_t in_stack_fffffffffffffba0;
  big_key bk;
  char *local_50;
  size_t vsize;
  ulong local_40;
  stat_t n_evicts;
  stat_t n_puts;
  
  vsize._4_4_ = key_gt_1K;
  srand(repl_p);
  n_evicts = 0;
  local_40 = 0;
  cache = (VMEMcache *)vmemcache_new();
  vmemcache_set_size(cache,0x100000);
  vmemcache_set_extent_size(cache,0x100);
  vmemcache_set_eviction_policy(cache,1);
  iVar1 = vmemcache_add(cache,dir);
  if (iVar1 == 0) {
    vmemcache_callback_on_evict(cache,on_evict_test_memory_leaks_cb,&local_40);
    sVar7 = 0;
    get = 0;
    while (local_40 < 1000) {
      iVar1 = rand();
      uVar3 = (ulong)(long)iVar1 % 0xff81;
      pcVar8 = (char *)(uVar3 + 0x80);
      __s1 = (char *)malloc((size_t)pcVar8);
      if (__s1 == (char *)0x0) {
        uVar4 = 0x2a8;
LAB_00104497:
        fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                ,uVar4,"test_memory_leaks");
        pcVar8 = "out of memory";
        sStackY_470 = 0xd;
        goto LAB_001044aa;
      }
      memset(__s1,0x2a,uVar3 + 0x7f);
      __s1[uVar3 + 0x7f] = '\0';
      if (vsize._4_4_ == 0) {
        psVar6 = &n_evicts;
        uVar4 = 8;
      }
      else {
        psVar6 = (stat_t *)&stack0xfffffffffffffba0;
        memset(psVar6,0x2a,0x400);
        uVar4 = 0x408;
      }
      iVar1 = vmemcache_put(cache,psVar6,uVar4,__s1,pcVar8);
      if (iVar1 != 0) {
        fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                ,0x2b9,"test_memory_leaks");
        sVar7 = n_evicts;
        uVar3 = local_40;
        pFVar5 = _stderr;
        uVar4 = vmemcache_errormsg();
        fprintf(pFVar5,"vmemcache_put(n_puts: %llu n_evicts: %llu): %s",sVar7,uVar3,uVar4);
        goto LAB_001044fa;
      }
      __s2 = (char *)malloc((size_t)pcVar8);
      if (__s2 == (char *)0x0) {
        uVar4 = 0x2bd;
        goto LAB_00104497;
      }
      if (vsize._4_4_ == 0) {
        psVar6 = &n_evicts;
        uVar4 = 8;
      }
      else {
        uVar4 = 0x408;
        psVar6 = (stat_t *)&stack0xfffffffffffffba0;
      }
      in_stack_fffffffffffffb98 = &local_50;
      pcVar2 = (char *)vmemcache_get(cache,psVar6,uVar4,__s2,pcVar8,0);
      if ((long)pcVar2 < 0) {
        fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                ,0x2c6,"test_memory_leaks");
        pFVar5 = _stderr;
        uVar4 = vmemcache_errormsg();
        pcVar8 = "vmemcache_get: %s";
        goto LAB_001043f8;
      }
      if (pcVar2 != pcVar8) {
        fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                ,0x2cb,"test_memory_leaks");
        __format = "vmemcache_get: wrong return value: %zi (should be %zu)";
LAB_001044f0:
        fprintf(_stderr,__format,pcVar2,pcVar8);
        goto LAB_001044fa;
      }
      if (pcVar8 != local_50) {
        fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                ,0x2d0,"test_memory_leaks");
        __format = "vmemcache_get: wrong size of value: %zi (should be %zu)";
        pcVar2 = local_50;
        goto LAB_001044f0;
      }
      iVar1 = strcmp(__s1,__s2);
      if (iVar1 != 0) {
        fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
                ,0x2d5,"test_memory_leaks");
        __format = "vmemcache_get: wrong value: %s (should be %s)";
        pcVar8 = __s1;
        pcVar2 = __s2;
        goto LAB_001044f0;
      }
      free(__s1);
      free(__s2);
      get = get + 1;
      sVar7 = n_evicts + 1;
      n_evicts = sVar7;
    }
    verify_stat_entries(cache,sVar7 - local_40);
    do {
      iVar1 = vmemcache_evict(cache,0,0);
    } while (iVar1 == 0);
    verify_stats(cache,n_evicts,get,get,0,local_40,(stat_t)in_stack_fffffffffffffb98,
                 in_stack_fffffffffffffba0,bk.buf._0_8_);
    vmemcache_delete(cache);
    if (local_40 == n_evicts) {
      return;
    }
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
            ,0x2ea,"test_memory_leaks");
    pcVar8 = "memory leak detected";
    sStackY_470 = 0x14;
LAB_001044aa:
    fwrite(pcVar8,sStackY_470,1,_stderr);
  }
  else {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_basic.c"
            ,0x29e,"test_memory_leaks");
    pFVar5 = _stderr;
    uVar4 = vmemcache_errormsg();
    pcVar8 = "vmemcache_new: %s";
LAB_001043f8:
    fprintf(pFVar5,pcVar8,uVar4);
  }
LAB_001044fa:
  fputc(10,_stderr);
  abort();
}

Assistant:

static void
test_memory_leaks(const char *dir, int key_gt_1K,
			enum vmemcache_repl_p repl_p,
			unsigned seed)
{
	char *vbuf;
	char *get_buf;
	size_t size;
	size_t vsize;
	int ret;
	ssize_t get_ret;
	struct big_key bk;

	srand(seed);

	stat_t n_puts = 0;
	stat_t n_evicts = 0;
	stat_t n_gets = 0;

	size_t min_size = VMEMCACHE_MIN_EXTENT / 2;
	size_t max_size = VMEMCACHE_MIN_POOL / 16;

	VMEMcache *cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_extent_size(cache, VMEMCACHE_MIN_EXTENT);
	vmemcache_set_eviction_policy(cache, repl_p);
	if (vmemcache_add(cache, dir))
		UT_FATAL("vmemcache_new: %s", vmemcache_errormsg());

	vmemcache_callback_on_evict(cache, on_evict_test_memory_leaks_cb,
					&n_evicts);

	while (n_evicts < 1000) {
		size = min_size + (size_t)rand() % (max_size - min_size + 1);

		vbuf = malloc(size);
		if (vbuf == NULL)
			UT_FATAL("out of memory");
		memset(vbuf, 42, size - 1);
		vbuf[size - 1] = '\0';

		if (key_gt_1K) {
			memset(bk.buf, 42 /* arbitrary */, sizeof(bk.buf));
			bk.n_puts = n_puts;

			ret = vmemcache_put(cache, &bk, sizeof(bk), vbuf, size);
		} else {
			ret = vmemcache_put(cache, &n_puts, sizeof(n_puts),
						vbuf, size);
		}

		if (ret)
			UT_FATAL(
				"vmemcache_put(n_puts: %llu n_evicts: %llu): %s",
				n_puts, n_evicts, vmemcache_errormsg());

		get_buf = malloc(size);
		if (get_buf == NULL)
			UT_FATAL("out of memory");
		if (key_gt_1K)
			get_ret = vmemcache_get(cache, &bk, sizeof(bk), get_buf,
							size, 0, &vsize);
		else
			get_ret = vmemcache_get(cache, &n_puts, sizeof(n_puts),
							get_buf, size, 0,
							&vsize);
		if (get_ret < 0)
			UT_FATAL("vmemcache_get: %s", vmemcache_errormsg());

		if ((size_t)get_ret != size)
			UT_FATAL(
				"vmemcache_get: wrong return value: %zi (should be %zu)",
				get_ret, size);

		if (size != vsize)
			UT_FATAL(
				"vmemcache_get: wrong size of value: %zi (should be %zu)",
				vsize, size);

		if (strcmp(vbuf, get_buf))
			UT_FATAL(
				"vmemcache_get: wrong value: %s (should be %s)",
				get_buf, vbuf);

		free(vbuf);
		free(get_buf);

		n_gets++;
		n_puts++;
	}

	verify_stat_entries(cache, n_puts - n_evicts);

	/* free all the memory */
	while (vmemcache_evict(cache, NULL, 0) == 0)
		;

	/* check statistics */
	verify_stats(cache, n_puts, n_gets, n_gets, 0, n_evicts, 0, 0, 0);

	vmemcache_delete(cache);

	if (n_evicts != n_puts)
		UT_FATAL("memory leak detected");
}